

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_duration(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  char cVar1;
  bool bVar2;
  XSValue_Data *pXVar3;
  XSValue *pXVar4;
  long lVar5;
  int iVar6;
  void *pvVar7;
  char *pcVar8;
  char *pcVar9;
  Status myStatus;
  char iv_3 [12];
  char iv_2 [15];
  char v_3 [13];
  char iv_1 [16];
  char v_2 [21];
  char v_1 [22];
  Status local_13c;
  StrX local_138;
  char local_128 [16];
  char local_118 [16];
  char local_108 [16];
  char local_f8 [16];
  undefined8 local_e8;
  undefined5 uStack_e0;
  undefined3 uStack_db;
  undefined5 uStack_d8;
  char local_c8 [32];
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  builtin_strncpy(local_c8,"   P1Y1M1DT1H1M1S   \n",0x16);
  local_e8._0_1_ = 'P';
  local_e8._1_1_ = '1';
  local_e8._2_1_ = 'Y';
  local_e8._3_1_ = '1';
  local_e8._4_1_ = 'M';
  local_e8._5_1_ = '3';
  local_e8._6_1_ = '1';
  local_e8._7_1_ = 'D';
  uStack_e0 = 0x3148333254;
  uStack_db = 0x4d3931;
  uStack_d8 = 0x53303231;
  builtin_strncpy(local_108 + 8,"T23H",5);
  builtin_strncpy(local_108,"-P1Y1M1D",8);
  builtin_strncpy(local_f8,"P-1Y2M3DT10H30M",0x10);
  builtin_strncpy(local_118,"P1Y1M1DT1H1M1X",0xf);
  builtin_strncpy(local_128,"P1Z1M1DT23H",0xc);
  local_13c = st_Init;
  local_138.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar1 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe24,local_c8,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  local_13c = st_Init;
  local_138.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar1 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe25,&local_e8,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  local_13c = st_Init;
  local_138.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar1 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe26,local_108,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  local_13c = st_Init;
  local_138.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar1 == '\0') {
    if (local_13c != st_FOCA0002) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      if ((ulong)local_13c < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe29,local_f8,local_138.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00120e13;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe29,local_f8,local_138.fLocalForm,0);
LAB_00120e13:
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  local_13c = st_Init;
  local_138.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar1 == '\0') {
    if (local_13c != st_FOCA0002) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      if ((ulong)local_13c < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe2a,local_118,local_138.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00120f19;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe2a,local_118,local_138.fLocalForm,0);
LAB_00120f19:
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  local_13c = st_Init;
  local_138.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar1 == '\0') {
    if (local_13c == st_FOCA0002) goto LAB_00121022;
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    if ((ulong)local_13c < 0xb) {
      pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
    }
    else {
      pcVar8 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xe2b,local_128,local_138.fLocalForm,"st_FOCA0002",pcVar8);
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe2b,local_128,local_138.fLocalForm,0);
  }
  StrX::~StrX(&local_138);
  errSeen = 1;
LAB_00121022:
  iVar6 = 1;
  do {
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0x5;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe45,local_c8);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      local_78 = 0x100000001;
      uStack_70 = 0x100000001;
      local_68 = 0x100000001;
      local_60 = 0;
      expValue.fValue.f_double = 2.12199579145934e-314;
      expValue._0_8_ = uStack_80;
      expValue.fValue._8_8_ = 0x100000001;
      expValue.fValue._16_8_ = 0x100000001;
      expValue.fValue.f_datetime.f_milisec = 0.0;
      bVar2 = compareActualValue(dt_duration,*pXVar3,expValue);
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0x5;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe46,&local_e8);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      local_a0 = 0x100000001;
      uStack_98 = 0x170000001f;
      local_90 = 0x7800000077;
      local_88 = 0;
      expValue_00.fValue.f_double = 2.12199579145934e-314;
      expValue_00._0_8_ = uStack_a8;
      expValue_00.fValue._8_8_ = 0x170000001f;
      expValue_00.fValue._16_8_ = 0x7800000077;
      expValue_00.fValue.f_datetime.f_milisec = 0.0;
      bVar2 = compareActualValue(dt_duration,*pXVar3,expValue_00);
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0x5;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe47,local_108);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      local_50 = 0xffffffffffffffff;
      uStack_48 = 0xffffffe9ffffffff;
      local_40 = 0;
      uStack_38 = 0;
      bVar2 = compareActualValue(dt_duration,*pXVar3,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0xffffffe9ffffffff,
                                                    CONCAT88(0xffffffffffffffff,uStack_58))));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_13c != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4a,local_f8,local_138.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pvVar7 = (void *)0xe4a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4a,local_f8);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_13c != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4b,local_118,local_138.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pvVar7 = (void *)0xe4b;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4b,local_118);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_13c != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4c,local_128,local_138.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pvVar7 = (void *)0xe4c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4c,local_128);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 == 0);
  iVar6 = 1;
  do {
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (lVar5 == 0) {
      if (local_13c != st_NoCanRep) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe68,local_c8,local_138.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_138);
        goto LAB_0012184c;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe68,local_c8);
      StrX::~StrX(&local_138);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_0012184c:
      errSeen = 1;
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (lVar5 == 0) {
      if (local_13c != st_NoCanRep) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe69,&local_e8,local_138.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_138);
        goto LAB_00121961;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe69,&local_e8);
      StrX::~StrX(&local_138);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00121961:
      errSeen = 1;
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (lVar5 == 0) {
      if (local_13c != st_NoCanRep) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe6a,local_108,local_138.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_138);
        goto LAB_00121a74;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe6a,local_108);
      StrX::~StrX(&local_138);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00121a74:
      errSeen = 1;
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_13c) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe6e,local_f8,local_138.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_138);
        goto LAB_00121ba5;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe6e,local_f8);
      StrX::~StrX(&local_138);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00121ba5:
      errSeen = 1;
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_13c) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe70,local_118,local_138.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_138);
        goto LAB_00121cd6;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe70,local_118);
      StrX::~StrX(&local_138);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00121cd6:
      errSeen = 1;
    }
    local_13c = st_Init;
    local_138.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_138.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_138.fUnicodeForm,dt_duration,&local_13c,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_13c) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_13c < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_13c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xe72,local_128,local_138.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_138);
        goto LAB_00121dfe;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe72,local_128);
      StrX::~StrX(&local_138);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00121dfe:
      errSeen = 1;
    }
    iVar6 = iVar6 + -1;
    if (iVar6 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_duration()
{
    const XSValue::DataType dt = XSValue::dt_duration;
    bool  toValidate = true;

    const char v_1[]="   P1Y1M1DT1H1M1S   \n";
    const char v_2[]="P1Y1M31DT23H119M120S";
    const char v_3[]="-P1Y1M1DT23H";

    const char iv_1[]="P-1Y2M3DT10H30M";
    const char iv_2[]="P1Y1M1DT1H1M1X";
    const char iv_3[]="P1Z1M1DT23H";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;
    act_v_ran_v_1.fValue.f_datetime.f_year    = 1;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 1;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 1;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 1;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 1;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 1;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 1;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 23;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 119;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 120;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = -1;
    act_v_ran_v_3.fValue.f_datetime.f_month   = -1;
    act_v_ran_v_3.fValue.f_datetime.f_day     = -1;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = -23;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}